

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_hevc.c
# Opt level: O0

int fd_hevc_uninit_context(HEVCContext *ctx)

{
  HEVCVPS *pHVar1;
  HEVCSPS *pHVar2;
  HEVCPPS *pHVar3;
  HEVCParamSets *pHVar4;
  HEVCVPS **ppHVar5;
  HEVCSPS **ppHVar6;
  HEVCPPS **ppHVar7;
  HEVCParamSets **ppHVar8;
  int local_64;
  int local_60;
  int i_2;
  int i_1;
  int i;
  HEVCContext *ctx_local;
  
  if (ctx->ps != (HEVCParamSets *)0x0) {
    for (i_2 = 0; i_2 < 0x10; i_2 = i_2 + 1) {
      ppHVar5 = ctx->ps->vps_list + i_2;
      if (*ppHVar5 != (HEVCVPS *)0x0) {
        pHVar1 = *ppHVar5;
        if (pHVar1 != (HEVCVPS *)0x0) {
          free((void *)((long)pHVar1 -
                       (long)(int)*(char *)((long)&pHVar1[-1].vps_num_hrd_parameters + 3)));
        }
        *ppHVar5 = (HEVCVPS *)0x0;
      }
    }
    for (local_60 = 0; local_60 < 0x20; local_60 = local_60 + 1) {
      ppHVar6 = ctx->ps->sps_list + local_60;
      if (*ppHVar6 != (HEVCSPS *)0x0) {
        pHVar2 = *ppHVar6;
        if (pHVar2 != (HEVCSPS *)0x0) {
          free((void *)((long)pHVar2 -
                       (long)(int)(char)*(undefined1 *)((long)&pHVar2[-1].qp_bd_offset + 3)));
        }
        *ppHVar6 = (HEVCSPS *)0x0;
      }
    }
    for (local_64 = 0; local_64 < 0x100; local_64 = local_64 + 1) {
      ppHVar7 = ctx->ps->pps_list + local_64;
      if (*ppHVar7 != (HEVCPPS *)0x0) {
        pHVar3 = *ppHVar7;
        if (pHVar3 != (HEVCPPS *)0x0) {
          free((void *)((long)pHVar3 - (long)(int)(char)pHVar3[-1].field_0x16cf));
        }
        *ppHVar7 = (HEVCPPS *)0x0;
      }
    }
    ppHVar8 = &ctx->ps;
    if (*ppHVar8 != (HEVCParamSets *)0x0) {
      pHVar4 = *ppHVar8;
      if (pHVar4 != (HEVCParamSets *)0x0) {
        free((void *)((long)pHVar4 - (long)(int)*(char *)((long)&pHVar4[-1].pps + 7)));
      }
      *ppHVar8 = (HEVCParamSets *)0x0;
    }
  }
  if (ctx != (HEVCContext *)0x0) {
    free((void *)((long)ctx - (long)(int)*(char *)((long)&ctx[-1].min_mastering_luminance + 3)));
  }
  return 0;
}

Assistant:

int fd_hevc_uninit_context(HEVCContext *ctx)
{
    if(ctx->ps)
    {
        for(int i = 0; i < 16; i++)
            fd_freep((void **)&ctx->ps->vps_list[i]);
        for(int i = 0; i < 32; i++)
            fd_freep((void **)&ctx->ps->sps_list[i]);
        for(int i = 0; i < 256; i++)
            fd_freep((void **)&ctx->ps->pps_list[i]);
        fd_freep((void **)&ctx->ps);
    }
    fd_free(ctx);
    return 0;
}